

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O1

Abc_Ntk_t * Mpm_ManPerformCellMapping(Mig_Man_t *pMig,Mpm_Par_t *pPars,Mio_Library_t *pMio)

{
  Mpm_Man_t *p;
  Vec_Wec_t *pVVar1;
  Abc_Ntk_t *pAVar2;
  
  if (pPars->fMap4Gates != 0) {
    p = Mpm_ManStart(pMig,pPars);
    if (p->pPars->fVerbose != 0) {
      Mpm_ManPrintStatsInit(p);
    }
    pVVar1 = Mpm_ManFindDsdMatches(p,p->pPars->pScl);
    p->vNpnConfigs = pVVar1;
    Mpm_ManPrepare(p);
    Mpm_ManPerform(p);
    if (p->pPars->fVerbose != 0) {
      Mpm_ManPrintStats(p);
    }
    pAVar2 = Mpm_ManDeriveMappedAbcNtk(p,pMio);
    Mpm_ManStop(p);
    return pAVar2;
  }
  __assert_fail("pPars->fMap4Gates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                ,0x10c,
                "Abc_Ntk_t *Mpm_ManPerformCellMapping(Mig_Man_t *, Mpm_Par_t *, Mio_Library_t *)");
}

Assistant:

Abc_Ntk_t * Mpm_ManPerformCellMapping( Mig_Man_t * pMig, Mpm_Par_t * pPars, Mio_Library_t * pMio )
{
    Abc_Ntk_t * pNew;
    Mpm_Man_t * p;
    assert( pPars->fMap4Gates );
    p = Mpm_ManStart( pMig, pPars );
    if ( p->pPars->fVerbose ) 
        Mpm_ManPrintStatsInit( p );
    p->vNpnConfigs = Mpm_ManFindDsdMatches( p, p->pPars->pScl );
    Mpm_ManPrepare( p );
    Mpm_ManPerform( p );
    if ( p->pPars->fVerbose ) 
        Mpm_ManPrintStats( p );
    pNew = Mpm_ManDeriveMappedAbcNtk( p, pMio );
    Mpm_ManStop( p );
    return pNew;
}